

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

int Gia_ManUnivTfo_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vNodes,Vec_Int_t *vPos)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iObj] == p->nTravIds) {
    return 0;
  }
  p->pTravIds[iObj] = p->nTravIds;
  if (vNodes != (Vec_Int_t *)0x0) {
    if ((iObj < 0) || (p->nObjs <= iObj)) goto LAB_0079740e;
    if ((~*(uint *)(p->pObjs + (uint)iObj) & 0x1fffffff) != 0 &&
        (int)*(uint *)(p->pObjs + (uint)iObj) < 0) {
      Vec_IntPush(vNodes,iObj);
    }
  }
  if (vPos != (Vec_Int_t *)0x0) {
    if ((iObj < 0) || (p->nObjs <= iObj)) {
LAB_0079740e:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if ((~*(uint *)(p->pObjs + (uint)iObj) & 0x1fffffff) != 0 &&
        (int)*(uint *)(p->pObjs + (uint)iObj) < 0) {
      Vec_IntPush(vPos,iObj);
    }
  }
  if (-1 < iObj) {
    iVar4 = 0;
    iVar5 = 1;
    while (iObj < p->vFanoutNums->nSize) {
      if (p->vFanoutNums->pArray[(uint)iObj] <= iVar4) {
        return iVar5;
      }
      iVar2 = p->vFanout->nSize;
      if (iVar2 <= iObj) break;
      piVar1 = p->vFanout->pArray;
      uVar3 = piVar1[(uint)iObj] + iVar4;
      if (((int)uVar3 < 0) || (iVar2 <= (int)uVar3)) break;
      iVar2 = Gia_ManUnivTfo_rec(p,piVar1[uVar3],vNodes,vPos);
      iVar5 = iVar5 + iVar2;
      iVar4 = iVar4 + 1;
      if (iObj < 0) break;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ManUnivTfo_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vNodes, Vec_Int_t * vPos )
{
    int i, iFan, Count = 1;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    if ( vNodes && Gia_ObjIsCo(Gia_ManObj(p, iObj)) )
        Vec_IntPush( vNodes, iObj );    
    if ( vPos && Gia_ObjIsCo(Gia_ManObj(p, iObj)) )
        Vec_IntPush( vPos, iObj );
    Gia_ObjForEachFanoutStaticId( p, iObj, iFan, i )
        Count += Gia_ManUnivTfo_rec( p, iFan, vNodes, vPos );
    return Count;
}